

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_AllHonors_SevenPairsForm_Test::
~TEST_DoublingFactorCounterTest_AllHonors_SevenPairsForm_Test
          (TEST_DoublingFactorCounterTest_AllHonors_SevenPairsForm_Test *this)

{
  TEST_DoublingFactorCounterTest_AllHonors_SevenPairsForm_Test *mem;
  TEST_DoublingFactorCounterTest_AllHonors_SevenPairsForm_Test *this_local;
  
  mem = this;
  ~TEST_DoublingFactorCounterTest_AllHonors_SevenPairsForm_Test(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, AllHonors_SevenPairsForm)
{
	addPair(Tile::EastWind);
	addPair(Tile::SouthWind);
	addPair(Tile::WestWind);
	addPair(Tile::NorthWind);
	addPair(Tile::WhiteDragon);
	addPair(Tile::RedDragon);
	addPair(Tile::GreenDragon);	

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::AllHonors));
	CHECK_EQUAL(100, r.doubling_factor);
}